

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int ERKStepGetCurrentButcherTable(void *arkode_mem,ARKodeButcherTable *B)

{
  int iVar1;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeERKStepMem local_18;
  ARKodeMem local_10;
  
  iVar1 = erkStep_AccessARKODEStepMem
                    (arkode_mem,"ERKStepGetCurrentButcherTable",&local_10,&local_18);
  if (iVar1 == 0) {
    *B = local_18->B;
  }
  return iVar1;
}

Assistant:

int ERKStepGetCurrentButcherTable(void* arkode_mem, ARKodeButcherTable* B)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeERKStepMem structures */
  retval = erkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* get tables from step_mem */
  *B = step_mem->B;
  return (ARK_SUCCESS);
}